

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

void __thiscall
o3dgc::Static_Data_Model::set_distribution
          (Static_Data_Model *this,uint number_of_symbols,double *probability)

{
  char cVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  if (number_of_symbols - 0x801 < 0xfffff801) {
    AC_Error("invalid number of data symbols");
  }
  if (this->data_symbols != number_of_symbols) {
    this->data_symbols = number_of_symbols;
    this->last_symbol = number_of_symbols - 1;
    if (this->distribution != (uint *)0x0) {
      operator_delete__(this->distribution);
      number_of_symbols = this->data_symbols;
    }
    if (number_of_symbols < 0x11) {
      uVar6 = 0;
      this->decoder_table = (uint *)0x0;
      this->table_size = 0;
      this->table_shift = 0;
      puVar3 = (uint *)operator_new__((ulong)(number_of_symbols * 4));
      this->distribution = puVar3;
      if (number_of_symbols == 0) {
        dVar7 = 0.0;
        goto LAB_003ac6f7;
      }
    }
    else {
      iVar2 = -0xd;
      do {
        cVar1 = (char)iVar2;
        iVar2 = iVar2 + 1;
      } while ((uint)(1 << (cVar1 + 0x12U & 0x1f)) < number_of_symbols);
      uVar5 = 1 << (cVar1 + 0x10U & 0x1f);
      this->table_size = uVar5;
      this->table_shift = -iVar2;
      puVar3 = (uint *)operator_new__((ulong)(number_of_symbols + uVar5 + 2) << 2);
      this->distribution = puVar3;
      this->decoder_table = puVar3 + number_of_symbols;
    }
  }
  dVar8 = 1.0 / (double)number_of_symbols;
  uVar4 = 0;
  dVar7 = 0.0;
  uVar6 = 0;
  do {
    if (probability != (double *)0x0) {
      dVar8 = probability[uVar4];
    }
    if ((dVar8 < 0.0001) || (0.9999 < dVar8)) {
      AC_Error("invalid symbol probability");
    }
    this->distribution[uVar4] = (uint)(long)(dVar7 * 32768.0);
    if ((this->table_size != 0) &&
       (uVar5 = this->distribution[uVar4] >> ((byte)this->table_shift & 0x1f), (uint)uVar6 < uVar5))
    {
      do {
        this->decoder_table[uVar6 + 1] = (int)uVar4 - 1;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      uVar6 = (ulong)uVar5;
    }
    dVar7 = dVar7 + dVar8;
    uVar4 = uVar4 + 1;
  } while (uVar4 < this->data_symbols);
LAB_003ac6f7:
  if (this->table_size != 0) {
    *this->decoder_table = 0;
    while ((uint)uVar6 <= this->table_size) {
      uVar6 = (ulong)((uint)uVar6 + 1);
      this->decoder_table[uVar6] = this->data_symbols - 1;
    }
  }
  if ((0.9999 <= dVar7) && (dVar7 <= 1.0001)) {
    return;
  }
  AC_Error("invalid probabilities");
}

Assistant:

void Static_Data_Model::set_distribution(unsigned number_of_symbols,
                                             const double probability[])
    {
      if ((number_of_symbols < 2) || (number_of_symbols > (1 << 11)))
        AC_Error("invalid number of data symbols");

      if (data_symbols != number_of_symbols) {     // assign memory for data model
        data_symbols = number_of_symbols;
        last_symbol = data_symbols - 1;
        delete [] distribution;
                                         // define size of table for fast decoding
        if (data_symbols > 16) {
          unsigned table_bits = 3;
          while (data_symbols > (1U << (table_bits + 2))) ++table_bits;
          table_size  = 1 << table_bits;
          table_shift = DM__LengthShift - table_bits;
          distribution = new unsigned[data_symbols+table_size+2];
          decoder_table = distribution + data_symbols;
        }
        else {                                  // small alphabet: no table needed
          decoder_table = 0;
          table_size = table_shift = 0;
          distribution = new unsigned[data_symbols];
        }
        if (distribution == 0) AC_Error("cannot assign model memory");
      }
                                 // compute cumulative distribution, decoder table
      unsigned s = 0;
      double sum = 0.0, p = 1.0 / double(data_symbols);

      for (unsigned k = 0; k < data_symbols; k++) {
        if (probability) p = probability[k];
        if ((p < 0.0001) || (p > 0.9999)) AC_Error("invalid symbol probability");
        distribution[k] = unsigned(sum * (1 << DM__LengthShift));
        sum += p;
        if (table_size == 0) continue;
        unsigned w = distribution[k] >> table_shift;
        while (s < w) decoder_table[++s] = k - 1;
      }

      if (table_size != 0) {
        decoder_table[0] = 0;
        while (s <= table_size) decoder_table[++s] = data_symbols - 1;
      }

      if ((sum < 0.9999) || (sum > 1.0001)) AC_Error("invalid probabilities");
    }